

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

size_t __thiscall
Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create
          (AMFImporter *this,string *pID_R,string *pID_G,string *pID_B,string *pID_A)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t __n;
  CAMFImporter_NodeElement_Texture *pCVar4;
  CAMFImporter_NodeElement_Texture *pCVar5;
  pointer puVar6;
  string *pID;
  string *pID_00;
  string *pID_01;
  undefined1 *__s2;
  size_t sVar7;
  int iVar8;
  size_t idx_target;
  long *plVar9;
  runtime_error *prVar10;
  pointer puVar11;
  _Node *p_Var12;
  long *plVar13;
  CAMFImporter_NodeElement_Texture **ppCVar14;
  ulong *puVar15;
  ulong uVar16;
  pointer puVar17;
  SPP_Texture *pSVar18;
  CAMFImporter_NodeElement_Texture *pCVar19;
  pointer puVar20;
  ulong uVar21;
  list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>> *plVar22;
  pointer puVar23;
  CAMFImporter_NodeElement_Texture *pCVar24;
  pointer puVar25;
  SPP_Texture *pSVar26;
  SPP_Texture *pSVar27;
  bool bVar28;
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  src_texture_4check;
  CAMFImporter_NodeElement *t_tex;
  SPP_Texture converted_texture;
  string TextureConverted_ID;
  CAMFImporter_NodeElement_Texture **local_188;
  iterator iStack_180;
  CAMFImporter_NodeElement_Texture *local_178;
  long lStack_170;
  string *local_160;
  CAMFImporter_NodeElement_Texture *local_158;
  CAMFImporter_NodeElement_Texture *local_150;
  long local_148;
  undefined1 local_140 [48];
  CAMFImporter_NodeElement *local_110;
  undefined1 local_108 [16];
  SPP_Texture local_f8;
  string *local_a8;
  string *local_a0;
  uchar *local_98 [2];
  uchar local_88 [16];
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  string *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = 0;
  if ((((pID_R->_M_string_length == 0) && (pID_G->_M_string_length == 0)) &&
      (pID_B->_M_string_length == 0)) && (pID_A->_M_string_length == 0)) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_f8.ID._M_dataplus._M_p = (pointer)&local_f8.ID.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.",
               "");
    std::runtime_error::runtime_error(prVar10,(string *)&local_f8);
    *(undefined ***)prVar10 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98[0] = local_88;
  pcVar3 = (pID_R->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,pcVar3 + pID_R->_M_string_length);
  std::__cxx11::string::append((char *)local_98);
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_98,(ulong)(pID_G->_M_dataplus)._M_p);
  plVar13 = plVar9 + 2;
  if ((long *)*plVar9 == plVar13) {
    local_40 = *plVar13;
    lStack_38 = plVar9[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar13;
    local_50 = (long *)*plVar9;
  }
  local_48 = plVar9[1];
  *plVar9 = (long)plVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
  pCVar19 = (CAMFImporter_NodeElement_Texture *)(plVar9 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar9 == pCVar19) {
    local_108._0_8_ = (pCVar19->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_108._8_8_ = plVar9[3];
    local_140._40_8_ = (CAMFImporter_NodeElement_Texture *)local_108;
  }
  else {
    local_108._0_8_ = (pCVar19->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_140._40_8_ = (CAMFImporter_NodeElement_Texture *)*plVar9;
  }
  local_110 = (CAMFImporter_NodeElement *)plVar9[1];
  *plVar9 = (long)pCVar19;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_160 = pID_R;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             (local_140 + 0x28,(ulong)(pID_B->_M_dataplus)._M_p);
  ppCVar14 = (CAMFImporter_NodeElement_Texture **)(plVar9 + 2);
  if ((CAMFImporter_NodeElement_Texture **)*plVar9 == ppCVar14) {
    local_178 = *ppCVar14;
    lStack_170 = plVar9[3];
    local_188 = &local_178;
  }
  else {
    local_178 = *ppCVar14;
    local_188 = (CAMFImporter_NodeElement_Texture **)*plVar9;
  }
  iStack_180._M_current = (CAMFImporter_NodeElement_Texture **)plVar9[1];
  *plVar9 = (long)ppCVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_150 = (CAMFImporter_NodeElement_Texture *)local_140;
  pCVar19 = (CAMFImporter_NodeElement_Texture *)(plVar9 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar9 == pCVar19) {
    local_140._0_8_ = (pCVar19->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_140._8_8_ = plVar9[3];
  }
  else {
    local_140._0_8_ = (pCVar19->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_150 = (CAMFImporter_NodeElement_Texture *)*plVar9;
  }
  local_148 = plVar9[1];
  *plVar9 = (long)pCVar19;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_150,(ulong)(pID_A->_M_dataplus)._M_p);
  paVar2 = &local_f8.ID.field_2;
  puVar15 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_f8.ID.field_2._M_allocated_capacity = *puVar15;
    local_f8.ID.field_2._8_8_ = plVar9[3];
    local_f8.ID._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_f8.ID.field_2._M_allocated_capacity = *puVar15;
    local_f8.ID._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_f8.ID._M_string_length = plVar9[1];
  pSVar18 = &local_f8;
  *plVar9 = (long)puVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_a8 = pID_G;
  local_a0 = pID_B;
  std::__cxx11::string::operator=((string *)&local_78,(string *)pSVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.ID._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.ID._M_dataplus._M_p);
  }
  if (local_150 != (CAMFImporter_NodeElement_Texture *)local_140) {
    operator_delete(local_150);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188);
  }
  if ((CAMFImporter_NodeElement_Texture *)local_140._40_8_ !=
      (CAMFImporter_NodeElement_Texture *)local_108) {
    operator_delete((void *)local_140._40_8_);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  sVar7 = local_70;
  __s2 = local_78;
  plVar22 = (list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
             *)&this->mTexture_Converted;
  pSVar26 = (SPP_Texture *)0xffffffffffffffff;
  local_140._32_8_ = plVar22;
  do {
    plVar22 = *(list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
                **)plVar22;
    if (plVar22 ==
        (list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>> *)
        local_140._32_8_) {
      pSVar27 = (SPP_Texture *)((long)&(pSVar26->ID)._M_dataplus._M_p + 1);
      goto LAB_003c6443;
    }
    __n = *(size_t *)(plVar22 + 0x18);
    if (__n == sVar7) {
      if (__n == 0) {
        bVar28 = true;
      }
      else {
        iVar8 = bcmp(*(void **)(plVar22 + 0x10),__s2,__n);
        bVar28 = iVar8 == 0;
      }
    }
    else {
      bVar28 = false;
    }
    pSVar26 = (SPP_Texture *)((long)&(pSVar26->ID)._M_dataplus._M_p + 1);
  } while (!bVar28);
  pSVar27 = (SPP_Texture *)(pSVar26->FormatHint + ((ulong)(byte)(bVar28 + 1) - 0x39));
  pSVar18 = pSVar26;
LAB_003c6443:
  pID_01 = local_a0;
  pID_00 = local_a8;
  pID = local_160;
  if (plVar22 ==
      (list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>> *)
      local_140._32_8_) {
    local_188 = (CAMFImporter_NodeElement_Texture **)0x0;
    iStack_180._M_current = (CAMFImporter_NodeElement_Texture **)0x0;
    local_178 = (CAMFImporter_NodeElement_Texture *)0x0;
    local_f8.ID._M_dataplus._M_p = (pointer)&local_f8.ID.field_2;
    local_f8.ID._M_string_length = 0;
    local_f8.ID.field_2._M_allocated_capacity =
         local_f8.ID.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_158 = (CAMFImporter_NodeElement_Texture *)0x0;
    if (local_160->_M_string_length != 0) {
      bVar28 = Find_NodeElement(this,local_160,ENET_Texture,(CAMFImporter_NodeElement **)&local_150)
      ;
      if (!bVar28) {
        Throw_ID_NotFound(this,pID);
      }
      local_140._40_8_ = local_150;
      local_158 = local_150;
      if ((CAMFImporter_NodeElement_Texture *)iStack_180._M_current == local_178) {
        std::
        vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
        ::_M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                  ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                    *)&local_188,iStack_180,(CAMFImporter_NodeElement_Texture **)(local_140 + 0x28))
        ;
      }
      else {
        *iStack_180._M_current = local_150;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
    }
    if (pID_00->_M_string_length == 0) {
      local_140._16_8_ = (CAMFImporter_NodeElement_Texture *)0x0;
      pCVar19 = local_158;
    }
    else {
      bVar28 = Find_NodeElement(this,pID_00,ENET_Texture,(CAMFImporter_NodeElement **)&local_150);
      pCVar19 = local_158;
      if (!bVar28) {
        Throw_ID_NotFound(this,pID_00);
      }
      local_140._40_8_ = local_150;
      local_140._16_8_ = local_150;
      if ((CAMFImporter_NodeElement_Texture *)iStack_180._M_current == local_178) {
        std::
        vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
        ::_M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                  ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                    *)&local_188,iStack_180,(CAMFImporter_NodeElement_Texture **)(local_140 + 0x28))
        ;
      }
      else {
        *iStack_180._M_current = local_150;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
    }
    if (pID_01->_M_string_length == 0) {
      local_140._24_8_ = (CAMFImporter_NodeElement_Texture *)0x0;
    }
    else {
      bVar28 = Find_NodeElement(this,pID_01,ENET_Texture,(CAMFImporter_NodeElement **)&local_150);
      if (!bVar28) {
        Throw_ID_NotFound(this,pID_01);
      }
      local_140._40_8_ = local_150;
      local_140._24_8_ = local_150;
      if ((CAMFImporter_NodeElement_Texture *)iStack_180._M_current == local_178) {
        std::
        vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
        ::_M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                  ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                    *)&local_188,iStack_180,(CAMFImporter_NodeElement_Texture **)(local_140 + 0x28))
        ;
      }
      else {
        *iStack_180._M_current = local_150;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
    }
    if (pID_A->_M_string_length == 0) {
      pCVar24 = (CAMFImporter_NodeElement_Texture *)0x0;
    }
    else {
      bVar28 = Find_NodeElement(this,pID_A,ENET_Texture,(CAMFImporter_NodeElement **)&local_150);
      if (!bVar28) {
        Throw_ID_NotFound(this,pID_A);
      }
      pCVar24 = local_150;
      local_140._40_8_ = local_150;
      if ((CAMFImporter_NodeElement_Texture *)iStack_180._M_current == local_178) {
        std::
        vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
        ::_M_realloc_insert<CAMFImporter_NodeElement_Texture*>
                  ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                    *)&local_188,iStack_180,(CAMFImporter_NodeElement_Texture **)(local_140 + 0x28))
        ;
      }
      else {
        *iStack_180._M_current = local_150;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
    }
    uVar16 = (long)iStack_180._M_current - (long)local_188 >> 3;
    if (1 < uVar16) {
      uVar21 = 1;
      while (uVar16 != uVar21) {
        pCVar4 = local_188[uVar21 - 1];
        pCVar5 = local_188[uVar21];
        if (((pCVar4->Width != pCVar5->Width) || (pCVar4->Height != pCVar5->Height)) ||
           (uVar21 = uVar21 + 1, pCVar4->Depth != pCVar5->Depth)) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_150 = (CAMFImporter_NodeElement_Texture *)local_140;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,
                     "PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size."
                     ,"");
          std::runtime_error::runtime_error(prVar10,(string *)&local_150);
          *(undefined ***)prVar10 = &PTR__runtime_error_00900168;
          __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    local_f8.Width = (*local_188)->Width;
    local_f8.Height = (*local_188)->Height;
    local_f8.Depth = (*local_188)->Depth;
    local_f8.Tiled = false;
    if (iStack_180._M_current != local_188) {
      uVar21 = 0;
      local_f8.Tiled = false;
      do {
        local_f8.Tiled = (bool)(local_f8.Tiled | local_188[uVar21]->Tiled);
        uVar21 = uVar21 + 1;
      } while ((uVar21 & 0xff) < uVar16);
    }
    builtin_strncpy(local_f8.FormatHint,"rgba0000",9);
    local_160 = (string *)local_160->_M_string_length;
    if (local_160 != (string *)0x0) {
      builtin_strncpy(local_f8.FormatHint,"rgba8000",8);
    }
    if (pID_00->_M_string_length != 0) {
      local_f8.FormatHint[5] = '8';
    }
    if (pID_01->_M_string_length != 0) {
      local_f8.FormatHint[6] = '8';
    }
    if (pID_A->_M_string_length != 0) {
      local_f8.FormatHint[7] = '8';
    }
    bVar28 = pCVar19 != (CAMFImporter_NodeElement_Texture *)0x0 && local_160 != (string *)0x0;
    if (bVar28) {
      puVar20 = (pCVar19->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                -(long)(pCVar19->Data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
    }
    else {
      puVar20 = (pointer)0x0;
    }
    puVar25 = (pointer)(ulong)bVar28;
    puVar17 = puVar25;
    if ((CAMFImporter_NodeElement_Texture *)local_140._16_8_ !=
        (CAMFImporter_NodeElement_Texture *)0x0 && pID_00->_M_string_length != 0) {
      puVar20 = *(pointer *)(local_140._16_8_ + 0x70) +
                ((long)puVar20 -
                (long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (local_140._16_8_ + 0x68))->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start);
      puVar17 = puVar25 + 1;
    }
    puVar23 = puVar17;
    if ((CAMFImporter_NodeElement_Texture *)local_140._24_8_ !=
        (CAMFImporter_NodeElement_Texture *)0x0 && pID_01->_M_string_length != 0) {
      puVar20 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_140._24_8_ + 0x68)
                 )->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish +
                ((long)puVar20 -
                (long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (local_140._24_8_ + 0x68))->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                      super__Vector_impl_data._M_start);
      puVar23 = puVar17 + 1;
    }
    if (pCVar24 != (CAMFImporter_NodeElement_Texture *)0x0 && pID_A->_M_string_length != 0) {
      puVar20 = (pCVar24->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish +
                ((long)puVar20 -
                (long)(pCVar24->Data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      puVar23 = puVar23 + 1;
    }
    local_58 = pID_A;
    local_f8.Data = (uint8_t *)operator_new__((ulong)puVar20);
    if ((local_160 != (string *)0x0) && (puVar20 != (pointer)0x0)) {
      if (local_158 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003c6aeb;
      puVar11 = (pointer)0x0;
      uVar16 = 0;
      do {
        puVar6 = (local_158->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_158->Data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar6) <= uVar16)
        goto LAB_003c6a74;
        local_f8.Data[(long)puVar11] = puVar6[uVar16];
        puVar11 = puVar11 + (long)puVar23;
        uVar16 = uVar16 + 1;
      } while (puVar11 < puVar20);
    }
    if ((puVar25 < puVar20) && (local_a8->_M_string_length != 0)) {
      if ((CAMFImporter_NodeElement_Texture *)local_140._16_8_ ==
          (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003c6aeb;
      uVar16 = 0;
      do {
        puVar11 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (local_140._16_8_ + 0x68))->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)*(pointer *)(local_140._16_8_ + 0x70) - (long)puVar11) <= uVar16)
        goto LAB_003c6a74;
        local_f8.Data[(long)puVar25] = puVar11[uVar16];
        puVar25 = puVar25 + (long)puVar23;
        uVar16 = uVar16 + 1;
      } while (puVar25 < puVar20);
    }
    if ((local_a0->_M_string_length != 0) && (puVar17 < puVar20)) {
      if ((CAMFImporter_NodeElement_Texture *)local_140._24_8_ ==
          (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003c6aeb;
      uVar16 = 0;
      do {
        puVar25 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (local_140._24_8_ + 0x68))->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           (local_140._24_8_ + 0x68))->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (long)puVar25) <= uVar16)
        goto LAB_003c6a74;
        local_f8.Data[(long)puVar17] = puVar25[uVar16];
        puVar17 = puVar17 + (long)puVar23;
        uVar16 = uVar16 + 1;
      } while (puVar17 < puVar20);
    }
    if ((local_58->_M_string_length != 0) && (puVar17 = puVar23 + -1, puVar17 < puVar20)) {
      if (pCVar24 == (CAMFImporter_NodeElement_Texture *)0x0) {
LAB_003c6aeb:
        __assert_fail("tex",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/AMF/AMFImporter_Postprocess.cpp"
                      ,0x120,
                      "auto Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string &, const std::string &, const std::string &, const std::string &)::(anonymous class)::operator()(const std::string &, const size_t, const size_t, const uint8_t) const"
                     );
      }
      uVar16 = 0;
      do {
        puVar25 = (pCVar24->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pCVar24->Data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar25) <= uVar16) {
LAB_003c6a74:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        local_f8.Data[(long)puVar17] = puVar25[uVar16];
        puVar17 = puVar17 + (long)puVar23;
        uVar16 = uVar16 + 1;
      } while (puVar17 < puVar20);
    }
    std::__cxx11::string::_M_assign((string *)&local_f8);
    p_Var12 = std::__cxx11::
              list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
              ::_M_create_node<Assimp::AMFImporter::SPP_Texture_const&>
                        ((list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
                          *)local_140._32_8_,&local_f8);
    std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
    psVar1 = &(this->mTexture_Converted).
              super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.ID._M_dataplus._M_p != &local_f8.ID.field_2) {
      operator_delete(local_f8.ID._M_dataplus._M_p);
    }
    pSVar18 = pSVar27;
    if (local_188 != (CAMFImporter_NodeElement_Texture **)0x0) {
      operator_delete(local_188);
    }
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return (size_t)pSVar18;
}

Assistant:

size_t AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string& pID_R, const std::string& pID_G, const std::string& pID_B,
																const std::string& pID_A)
{
    size_t TextureConverted_Index;
    std::string TextureConverted_ID;

	// check input data
	if(pID_R.empty() && pID_G.empty() && pID_B.empty() && pID_A.empty())
		throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.");

	// Create ID
	TextureConverted_ID = pID_R + "_" + pID_G + "_" + pID_B + "_" + pID_A;
	// Check if texture specified by set of IDs is converted already.
	TextureConverted_Index = 0;
	for(const SPP_Texture& tex_convd: mTexture_Converted)
	{
        if ( tex_convd.ID == TextureConverted_ID ) {
            return TextureConverted_Index;
        } else {
            ++TextureConverted_Index;
        }
	}

	//
	// Converted texture not found, create it.
	//
	CAMFImporter_NodeElement_Texture* src_texture[4]{nullptr};
	std::vector<CAMFImporter_NodeElement_Texture*> src_texture_4check;
	SPP_Texture converted_texture;

	{// find all specified source textures
		CAMFImporter_NodeElement* t_tex;

		// R
		if(!pID_R.empty())
		{
			if(!Find_NodeElement(pID_R, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_R);

			src_texture[0] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[0] = nullptr;
		}

		// G
		if(!pID_G.empty())
		{
			if(!Find_NodeElement(pID_G, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_G);

			src_texture[1] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[1] = nullptr;
		}

		// B
		if(!pID_B.empty())
		{
			if(!Find_NodeElement(pID_B, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_B);

			src_texture[2] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[2] = nullptr;
		}

		// A
		if(!pID_A.empty())
		{
			if(!Find_NodeElement(pID_A, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_A);

			src_texture[3] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[3] = nullptr;
		}
	}// END: find all specified source textures

	// check that all textures has same size
	if(src_texture_4check.size() > 1)
	{
		for (size_t i = 0, i_e = (src_texture_4check.size() - 1); i < i_e; i++)
		{
			if((src_texture_4check[i]->Width != src_texture_4check[i + 1]->Width) || (src_texture_4check[i]->Height != src_texture_4check[i + 1]->Height) ||
				(src_texture_4check[i]->Depth != src_texture_4check[i + 1]->Depth))
			{
				throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size.");
			}
		}
	}// if(src_texture_4check.size() > 1)

	// set texture attributes
	converted_texture.Width = src_texture_4check[0]->Width;
	converted_texture.Height = src_texture_4check[0]->Height;
	converted_texture.Depth = src_texture_4check[0]->Depth;
	// if one of source texture is tiled then converted texture is tiled too.
	converted_texture.Tiled = false;
	for(uint8_t i = 0; i < src_texture_4check.size(); i++) converted_texture.Tiled |= src_texture_4check[i]->Tiled;

	// Create format hint.
	strcpy(converted_texture.FormatHint, "rgba0000");// copy initial string.
	if(!pID_R.empty()) converted_texture.FormatHint[4] = '8';
	if(!pID_G.empty()) converted_texture.FormatHint[5] = '8';
	if(!pID_B.empty()) converted_texture.FormatHint[6] = '8';
	if(!pID_A.empty()) converted_texture.FormatHint[7] = '8';

	//
	// Сopy data of textures.
	//
	size_t tex_size = 0;
	size_t step = 0;
	size_t off_g = 0;
	size_t off_b = 0;

	// Calculate size of the target array and rule how data will be copied.
    if(!pID_R.empty() && nullptr != src_texture[ 0 ] ) {
        tex_size += src_texture[0]->Data.size(); step++, off_g++, off_b++;
    }
    if(!pID_G.empty() && nullptr != src_texture[ 1 ] ) {
        tex_size += src_texture[1]->Data.size(); step++, off_b++;
    }
    if(!pID_B.empty() && nullptr != src_texture[ 2 ] ) {
        tex_size += src_texture[2]->Data.size(); step++;
    }
    if(!pID_A.empty() && nullptr != src_texture[ 3 ] ) {
        tex_size += src_texture[3]->Data.size(); step++;
    }

    // Create target array.
	converted_texture.Data = new uint8_t[tex_size];
	// And copy data
	auto CopyTextureData = [&](const std::string& pID, const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void
	{
		if(!pID.empty())
		{
			for(size_t idx_target = pOffset, idx_src = 0; idx_target < tex_size; idx_target += pStep, idx_src++) {
				CAMFImporter_NodeElement_Texture* tex = src_texture[pSrcTexNum];
				ai_assert(tex);
				converted_texture.Data[idx_target] = tex->Data.at(idx_src);
			}
		}
	};// auto CopyTextureData = [&](const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void

	CopyTextureData(pID_R, 0, step, 0);
	CopyTextureData(pID_G, off_g, step, 1);
	CopyTextureData(pID_B, off_b, step, 2);
	CopyTextureData(pID_A, step - 1, step, 3);

	// Store new converted texture ID
	converted_texture.ID = TextureConverted_ID;
	// Store new converted texture
	mTexture_Converted.push_back(converted_texture);

	return TextureConverted_Index;
}